

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMixedMeshControl::CreateRotationMesh(TPZMHMixedMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  long lVar3;
  TPZCompEl *this_02;
  int iVar4;
  TPZMaterial *pTVar5;
  _Base_ptr p_Var6;
  TPZCompEl **ppTVar7;
  TPZCompElDisc *this_03;
  TPZGeoEl *pTVar8;
  TPZConnect *pTVar9;
  _Base_ptr p_Var10;
  long nelem;
  long lVar11;
  int it;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  _Rb_tree_color local_6c;
  TPZGeoMesh *local_68;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  this_00 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
  TPZGeoMesh::ResetReference(this_00);
  iVar2 = (this->super_TPZMHMeshControl).fpOrderInternal;
  this_01 = ((this->fRotationMesh).fRef)->fPointer;
  TPZGeoMesh::ResetReference(this_00);
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"RotationMesh","");
  TPZCompMesh::SetName(this_01,(string *)local_60);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  this_01->fDimModel = this_00->fDim;
  local_68 = this_00;
  TPZCreateApproximationSpace::SetAllCreateFunctionsDiscontinuous(&this_01->fCreate);
  this_01->fDefaultOrder = iVar2;
  iVar2 = this_01->fDimModel;
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = 0;
  local_38 = 0;
  p_Var6 = (this->super_TPZMHMeshControl).fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  p_Var1 = &(this->super_TPZMHMeshControl).fMaterialIds._M_t._M_impl.super__Rb_tree_header;
  local_40 = (_Base_ptr)local_60._24_8_;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      local_6c = p_Var6[1]._M_color;
      pTVar5 = TPZCompMesh::FindMaterial(this_01,local_6c);
      if (pTVar5 != (TPZMaterial *)0x0) {
        iVar4 = (**(code **)(*(long *)pTVar5 + 0x50))(pTVar5);
        if (iVar4 == iVar2) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     local_60,(int *)&local_6c);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  (**(code **)(*(long *)this_01 + 0xf8))(this_01,local_60);
  (**(code **)(*(long *)((this->fRotationMesh).fRef)->fPointer + 0x60))();
  lVar3 = (this_01->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar3) {
    lVar11 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this_01->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar11);
      if (*ppTVar7 == (TPZCompEl *)0x0) {
LAB_014485ff:
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                   ,0x1b3);
      }
      this_03 = (TPZCompElDisc *)
                __dynamic_cast(*ppTVar7,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
      if (this_03 == (TPZCompElDisc *)0x0) goto LAB_014485ff;
      pTVar8 = TPZCompEl::Reference((TPZCompEl *)this_03);
      iVar4 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8);
      if (iVar4 != iVar2) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                   ,0x1b6);
      }
      TPZCompElDisc::SetTotalOrderShape(this_03);
      TPZCompElDisc::SetFalseUseQsiEta(this_03);
      lVar11 = lVar11 + 1;
    } while (lVar3 != lVar11);
  }
  lVar11 = (this_01->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  if (0 < lVar11) {
    nelem = 0;
    do {
      pTVar9 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this_01->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      (pTVar9->field_2).fCompose.fLagrangeMultiplier = '\x01';
      nelem = nelem + 1;
    } while (lVar11 != nelem);
  }
  TPZGeoMesh::ResetReference(local_68);
  if (0 < lVar3) {
    lVar11 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this_01->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar11);
      this_02 = *ppTVar7;
      pTVar8 = TPZCompEl::Reference(this_02);
      p_Var6 = (this->super_TPZMHMeshControl).fMaterialIds._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_parent;
      if (p_Var6 != (_Base_ptr)0x0) {
        iVar2 = pTVar8->fMatId;
        p_Var10 = &p_Var1->_M_header;
        do {
          if (iVar2 <= (int)*(size_t *)(p_Var6 + 1)) {
            p_Var10 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < iVar2];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var10)->_M_node_count <= iVar2)) {
          TPZMHMeshControl::SetSubdomain
                    (&this->super_TPZMHMeshControl,this_02,
                     (this->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fStore
                     [pTVar8->fIndex]);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar3);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_60);
  return;
}

Assistant:

void TPZMHMixedMeshControl::CreateRotationMesh()
{
    TPZGeoMesh * gmesh = fGMesh.operator->();
    gmesh->ResetReference();
    int porder = fpOrderInternal;
    TPZCompMesh * cmeshRotation = fRotationMesh.operator->();
    gmesh->ResetReference();
    cmeshRotation->SetName("RotationMesh");
    cmeshRotation->SetDimModel(gmesh->Dimension());
    cmeshRotation->ApproxSpace().SetAllCreateFunctionsDiscontinuous();
    cmeshRotation->SetDefaultOrder(porder);
    
    int meshdim = cmeshRotation->Dimension();
    std::set<int> matids;
    for (auto it:fMaterialIds) {
        TPZMaterial *mat = cmeshRotation->FindMaterial(it);
        if (mat && mat->Dimension() == meshdim) {
            matids.insert(it);
        }
    }
    cmeshRotation->AutoBuild(matids);
    fRotationMesh->ExpandSolution();
    
    if(0)
    {
        std::ofstream out("RotationsMesh.txt");
        fPressureFineMesh->Print(out);
    }

    
    int64_t nel = cmeshRotation->NElements();
    for(int64_t i=0; i<nel; i++){
        TPZCompEl *cel = cmeshRotation->ElementVec()[i];
        TPZCompElDisc *celdisc = dynamic_cast<TPZCompElDisc *>(cel);
        if(!celdisc) DebugStop();
        if(celdisc && celdisc->Reference()->Dimension() != meshdim)
        {
            DebugStop();
        }
        celdisc->SetTotalOrderShape();
        celdisc->SetFalseUseQsiEta();
    }
    
    int64_t nc = cmeshRotation->NConnects();
    for (int64_t ic=0; ic<nc; ic++) {
        cmeshRotation->ConnectVec()[ic].SetLagrangeMultiplier(1);
    }
    gmesh->ResetReference();
    
    for (int64_t el=0; el<nel; el++)
    {
        TPZCompEl *cel = cmeshRotation->Element(el);
#ifdef PZDEBUG
        if (! cel) {
            DebugStop();
        }
#endif
        TPZGeoEl *gel = cel->Reference();
        if(fMaterialIds.find (gel->MaterialId()) == fMaterialIds.end())
        {
            continue;
        }
#ifdef PZDEBUG
        if (fGeoToMHMDomain[gel->Index()] == -1) {
            DebugStop();
        }
#endif
        
        SetSubdomain(cel, fGeoToMHMDomain[gel->Index()]);
    }
    
    
    return;
}